

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O3

void __thiscall
QTlsPrivate::TlsCryptographOpenSSL::alertMessageSent(TlsCryptographOpenSSL *this,int value)

{
  QSslSocket *pQVar1;
  char cVar2;
  char *pcVar3;
  AlertType AVar4;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = q_SSL_alert_type_string(value);
  AVar4 = 2;
  if (pcVar3 != (char *)0x0) {
    if (*pcVar3 == 'W') {
      AVar4 = CloseNotify;
    }
    else if (*pcVar3 == 'F') {
      cVar2 = QSslSocket::isEncrypted();
      AVar4 = 1;
      if (cVar2 == '\0') {
        this->pendingFatalAlert = true;
      }
    }
  }
  pQVar1 = this->q;
  anon_unknown.dwarf_1322f2::tlsAlertDescription(&local_48,value);
  QSslSocket::alertSent((AlertLevel)pQVar1,AVar4,(QString *)((ulong)(uint)value & 0xff));
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TlsCryptographOpenSSL::alertMessageSent(int value)
{
    Q_ASSERT(q);
    Q_ASSERT(d);

    const auto level = tlsAlertLevel(value);
    if (level == QSsl::AlertLevel::Fatal && !q->isEncrypted()) {
        // Note, this logic is handshake-time only:
        pendingFatalAlert = true;
    }

    emit q->alertSent(level, tlsAlertType(value), tlsAlertDescription(value));

}